

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

pair<pstore::indirect_string,_pstore::index::details::empty_class> * __thiscall
pstore::serialize::
read<std::pair<pstore::indirect_string,pstore::index::details::empty_class>,pstore::serialize::archive::database_reader>
          (pair<pstore::indirect_string,_pstore::index::details::empty_class>
           *__return_storage_ptr__,serialize *this,database_reader *archive)

{
  pair<pstore::indirect_string,_pstore::index::details::empty_class> *uninit;
  unique_ptr<std::pair<pstore::indirect_string,_pstore::index::details::empty_class>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
  local_48;
  unique_ptr<std::pair<pstore::indirect_string,_pstore::index::details::empty_class>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
  d;
  anon_class_1_0_00000001_for__M_head_impl dtor;
  T2 *t2;
  type uninit_buffer;
  database_reader *archive_local;
  
  uninit_buffer._._24_8_ = this;
  flood<pstore::serialize::details::aligned_storage<32ul,8ul>::type>((type *)&t2);
  read_uninit<pstore::serialize::archive::database_reader,std::pair<pstore::indirect_string,pstore::index::details::empty_class>>
            ((serialize *)uninit_buffer._._24_8_,(database_reader *)&t2,uninit);
  std::
  unique_ptr<std::pair<pstore::indirect_string,pstore::index::details::empty_class>,pstore::serialize::read<std::pair<pstore::indirect_string,pstore::index::details::empty_class>,pstore::serialize::archive::database_reader>(pstore::serialize::archive::database_reader&&)::{lambda(std::pair<pstore::indirect_string,pstore::index::details::empty_class>*)#1}>
  ::
  unique_ptr<pstore::serialize::read<std::pair<pstore::indirect_string,pstore::index::details::empty_class>,pstore::serialize::archive::database_reader>(pstore::serialize::archive::database_reader&&)::_lambda(std::pair<pstore::indirect_string,pstore::index::details::empty_class>*)_1_,void>
            ((unique_ptr<std::pair<pstore::indirect_string,pstore::index::details::empty_class>,pstore::serialize::read<std::pair<pstore::indirect_string,pstore::index::details::empty_class>,pstore::serialize::archive::database_reader>(pstore::serialize::archive::database_reader&&)::_lambda(std::pair<pstore::indirect_string,pstore::index::details::empty_class>*)_1_>
              *)&local_48,(pointer)&t2,
             (deleter_type *)
             ((long)&d._M_t.
                     super___uniq_ptr_impl<std::pair<pstore::indirect_string,_pstore::index::details::empty_class>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::pair<pstore::indirect_string,_pstore::index::details::empty_class>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
                     .
                     super__Head_base<0UL,_std::pair<pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
                     ._M_head_impl + 7));
  (__return_storage_ptr__->first).db_ = (database *)t2;
  (__return_storage_ptr__->first).is_pointer_ = (bool)uninit_buffer._[0];
  (__return_storage_ptr__->first).field_0x9 = uninit_buffer._[1];
  (__return_storage_ptr__->first).field_0xa = uninit_buffer._[2];
  (__return_storage_ptr__->first).field_0xb = uninit_buffer._[3];
  (__return_storage_ptr__->first).field_0xc = uninit_buffer._[4];
  (__return_storage_ptr__->first).field_0xd = uninit_buffer._[5];
  (__return_storage_ptr__->first).field_0xe = uninit_buffer._[6];
  (__return_storage_ptr__->first).field_0xf = uninit_buffer._[7];
  (__return_storage_ptr__->first).field_2 =
       (anon_union_8_2_d34ab9e4_for_indirect_string_3)uninit_buffer._._8_8_;
  __return_storage_ptr__->field_0x18 = uninit_buffer._[0x10];
  __return_storage_ptr__->field_0x19 = uninit_buffer._[0x11];
  __return_storage_ptr__->field_0x1a = uninit_buffer._[0x12];
  __return_storage_ptr__->field_0x1b = uninit_buffer._[0x13];
  __return_storage_ptr__->field_0x1c = uninit_buffer._[0x14];
  __return_storage_ptr__->field_0x1d = uninit_buffer._[0x15];
  __return_storage_ptr__->field_0x1e = uninit_buffer._[0x16];
  __return_storage_ptr__->field_0x1f = uninit_buffer._[0x17];
  std::
  unique_ptr<std::pair<pstore::indirect_string,_pstore::index::details::empty_class>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/types.hpp:422:25)>
  ::~unique_ptr(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Ty read (Archive && archive) {
            using T2 = typename std::remove_const<Ty>::type;
            typename details::aligned_storage<sizeof (T2), alignof (T2)>::type uninit_buffer;
            flood (&uninit_buffer);

            // Deserialize into the uninitialized buffer.
            auto & t2 = reinterpret_cast<T2 &> (uninit_buffer);
            read_uninit (std::forward<Archive> (archive), t2);

            // This object will destroy the remains of the T2 instance in uninit_buffer.
            auto dtor = [] (T2 * p) { p->~T2 (); };
            std::unique_ptr<T2, decltype (dtor)> d (&t2, dtor);
            return std::move (t2);
        }